

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O2

void list_set_and_clear(Am_Object *inter,Am_Object *old_object,Am_Object *new_object,
                       Am_Object *ref_object)

{
  Am_Value *pAVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Am_Object current;
  Am_Value_List all_objects;
  int stopErase;
  int startErase;
  int stopSet;
  int startSet;
  
  Am_Object::Get_Owner(&current,(Am_Slot_Flags)inter);
  pAVar1 = Am_Object::Get(&current,0x82,0);
  Am_Value_List::Am_Value_List(&all_objects,pAVar1);
  Am_Object::~Am_Object(&current);
  current.data = (Am_Object_Data *)0x0;
  calc_ranks(&startSet,&stopSet,&startErase,&stopErase,old_object,new_object,ref_object);
  if (startErase != -1) {
    Am_Value_List::Start(&all_objects);
    iVar2 = 0;
    if (0 < startErase) {
      iVar2 = startErase;
    }
    iVar3 = iVar2;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      Am_Value_List::Next(&all_objects);
    }
    for (; iVar2 <= stopErase; iVar2 = iVar2 + 1) {
      pAVar1 = Am_Value_List::Get(&all_objects);
      Am_Object::operator=(&current,pAVar1);
      Am_Object::Set(&current,0x172,false,1);
      Am_Value_List::Next(&all_objects);
    }
  }
  if (startSet != -1) {
    Am_Value_List::Start(&all_objects);
    iVar2 = 0;
    if (0 < startSet) {
      iVar2 = startSet;
    }
    iVar3 = iVar2;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      Am_Value_List::Next(&all_objects);
    }
    for (; iVar2 <= stopSet; iVar2 = iVar2 + 1) {
      pAVar1 = Am_Value_List::Get(&all_objects);
      Am_Object::operator=(&current,pAVar1);
      pAVar1 = Am_Object::Get(&current,0xcc,0);
      bVar4 = Am_Value::Valid(pAVar1);
      if (bVar4) {
        Am_Object::Set(&current,0x172,true,1);
      }
      Am_Value_List::Next(&all_objects);
    }
  }
  Am_Object::~Am_Object(&current);
  Am_Value_List::~Am_Value_List(&all_objects);
  return;
}

Assistant:

void
list_set_and_clear(Am_Object &inter, Am_Object &old_object,
                   Am_Object &new_object, Am_Object &ref_object)
{
  Am_Value_List all_objects = inter.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  Am_Object current;

  int startSet, stopSet, startErase, stopErase;
  calc_ranks(startSet, stopSet, startErase, stopErase, old_object, new_object,
             ref_object);
  if (startErase != -1) {
    int i;
    for (all_objects.Start(), i = 0; i < startErase; all_objects.Next(), i++)
      ;
    for (; i <= stopErase; all_objects.Next(), i++) {
      current = all_objects.Get();
      Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
      current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  }
  if (startSet != -1) {
    int i;
    for (all_objects.Start(), i = 0; i < startSet; all_objects.Next(), i++)
      ;
    for (; i <= stopSet; all_objects.Next(), i++) {
      current = all_objects.Get();
      if (current.Get(Am_ACTIVE).Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, true);
        current.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    }
  }
}